

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getDigits(char *zDate,...)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  char *pcVar12;
  int *local_e0;
  int local_c8 [18];
  va_list ap;
  
  local_e0 = (int *)&stack0x00000008;
  uVar1 = 8;
  iVar2 = 0;
  do {
    uVar10 = (ulong)uVar1;
    if (uVar10 < 0x29) {
      iVar6 = *(int *)((long)local_c8 + uVar10);
      uVar8 = uVar1 + 8;
      if (0x20 < uVar1) goto LAB_001a3e09;
      uVar8 = uVar1 + 0x10;
      iVar3 = *(int *)((long)local_c8 + uVar10 + 8);
      if (0x18 < uVar1) goto LAB_001a3e19;
      uVar8 = uVar1 + 0x18;
      iVar4 = *(int *)((long)local_c8 + uVar10 + 0x10);
      if (0x10 < uVar1) goto LAB_001a3e29;
      uVar8 = uVar1 | 0x20;
      iVar9 = *(int *)((long)local_c8 + uVar10 + 0x18);
      if (0x28 < uVar8) goto LAB_001a3e3a;
      piVar11 = (int *)((long)local_c8 + (ulong)uVar8);
      uVar1 = uVar1 + 0x28;
    }
    else {
      iVar6 = *local_e0;
      local_e0 = local_e0 + 2;
      uVar8 = uVar1;
LAB_001a3e09:
      iVar3 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_001a3e19:
      iVar4 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_001a3e29:
      iVar9 = *local_e0;
      local_e0 = local_e0 + 2;
LAB_001a3e3a:
      piVar11 = local_e0;
      local_e0 = local_e0 + 2;
      uVar1 = uVar8;
    }
    if (iVar6 == 0) {
      iVar7 = 0;
      pcVar12 = zDate;
    }
    else {
      pcVar12 = zDate + (ulong)(iVar6 - 1) + 1;
      lVar5 = 0;
      iVar7 = 0;
      do {
        if ((ulong)(byte)zDate[lVar5] - 0x3a < 0xfffffffffffffff6) {
          return iVar2;
        }
        iVar7 = (int)zDate[lVar5] + iVar7 * 10 + -0x30;
        lVar5 = lVar5 + 1;
      } while (iVar6 != (int)lVar5);
    }
    if (iVar7 < iVar3) {
      return iVar2;
    }
    if (iVar4 < iVar7) {
      return iVar2;
    }
    if (iVar9 == 0) {
      **(int **)piVar11 = iVar7;
      return iVar2 + 1;
    }
    if (iVar9 != *pcVar12) {
      return iVar2;
    }
    **(int **)piVar11 = iVar7;
    zDate = pcVar12 + 1;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int getDigits(const char *zDate, ...){
  va_list ap;
  int val;
  int N;
  int min;
  int max;
  int nextC;
  int *pVal;
  int cnt = 0;
  va_start(ap, zDate);
  do{
    N = va_arg(ap, int);
    min = va_arg(ap, int);
    max = va_arg(ap, int);
    nextC = va_arg(ap, int);
    pVal = va_arg(ap, int*);
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<min || val>max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *pVal = val;
    zDate++;
    cnt++;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}